

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_aastrip(CHAR_DATA *ch,char *argument)

{
  AREA_DATA_conflict *area;
  AREA_AFFECT_DATA *pAVar1;
  AREA_AFFECT_DATA *paf;
  
  area = ch->in_room->area;
  paf = area->affected;
  while (paf != (AREA_AFFECT_DATA *)0x0) {
    pAVar1 = paf->next;
    affect_remove_area(area,paf);
    paf = pAVar1;
  }
  act("All affects stripped from \'$t\'.",ch,area->name,(void *)0x0,3);
  return;
}

Assistant:

void do_aastrip(CHAR_DATA *ch, char *argument)
{
	AREA_AFFECT_DATA *af, *af_next;
	AREA_DATA *area = ch->in_room->area;

	for (af = area->affected; af; af = af_next)
	{
		af_next = af->next;
		affect_remove_area(area, af);
	}

	act("All affects stripped from '$t'.", ch, area->name, 0, TO_CHAR);
}